

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heuristics.cpp
# Opt level: O3

Table * __thiscall
Heuristics::popFromFrontierBestFirst(Table *__return_storage_ptr__,Heuristics *this)

{
  int iVar1;
  pointer pTVar2;
  undefined8 uVar3;
  ulong uVar4;
  pointer pTVar5;
  int iVar6;
  pointer pTVar7;
  ulong in_R8;
  int iVar8;
  
  __return_storage_ptr__->current_row = 1;
  __return_storage_ptr__->current_col = 1;
  __return_storage_ptr__->table[0][0] = '1';
  __return_storage_ptr__->table[0][1] = '3';
  __return_storage_ptr__->table[0][2] = '6';
  __return_storage_ptr__->table[1][0] = '4';
  __return_storage_ptr__->table[1][1] = ' ';
  __return_storage_ptr__->table[1][2] = '2';
  __return_storage_ptr__->table[2][0] = '7';
  __return_storage_ptr__->table[2][1] = '5';
  __return_storage_ptr__->table[2][2].number = '8';
  pTVar2 = (this->evaluatedChildren).super__Vector_base<Table,_std::allocator<Table>_>._M_impl.
           super__Vector_impl_data._M_start;
  pTVar5 = (this->evaluatedChildren).super__Vector_base<Table,_std::allocator<Table>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar4 = 0;
  if (pTVar2 != pTVar5) {
    iVar6 = __return_storage_ptr__->evaluationScore;
    iVar8 = 1000;
    pTVar7 = pTVar2;
    do {
      iVar1 = pTVar7->evaluationScore;
      if (iVar1 <= iVar8) {
        __return_storage_ptr__->current_col = pTVar7->current_col;
        uVar3 = *(undefined8 *)(pTVar7->table[2] + 2);
        *(undefined8 *)__return_storage_ptr__->table = *(undefined8 *)pTVar7->table;
        *(undefined8 *)(__return_storage_ptr__->table[2] + 2) = uVar3;
        in_R8 = uVar4;
        iVar6 = iVar1;
        iVar8 = iVar1;
      }
      uVar4 = (ulong)((int)uVar4 + 1);
      pTVar7 = pTVar7 + 1;
    } while (pTVar7 != pTVar5);
    __return_storage_ptr__->evaluationScore = iVar6;
    uVar4 = (ulong)(int)in_R8;
  }
  pTVar7 = pTVar2 + uVar4 + 1;
  if (pTVar7 != pTVar5) {
    memmove(pTVar2 + uVar4,pTVar7,(long)pTVar5 - (long)pTVar7);
    pTVar5 = (this->evaluatedChildren).super__Vector_base<Table,_std::allocator<Table>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  (this->evaluatedChildren).super__Vector_base<Table,_std::allocator<Table>_>._M_impl.
  super__Vector_impl_data._M_finish = pTVar5 + -1;
  return __return_storage_ptr__;
}

Assistant:

Table Heuristics::popFromFrontierBestFirst() {
    Table bestNextState;
    int score = 1000;
    int positionOfBest;
    int position = 0;
    for (Table table : evaluatedChildren) {
        if (table.evaluationScore <= score) {
            score = table.evaluationScore;
            positionOfBest = position;
            bestNextState = table;
        }
        position++;
    }
    evaluatedChildren.erase(evaluatedChildren.begin()+positionOfBest);
    return bestNextState;
}